

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array
          (Array<capnp::compiler::NodeTranslator::BrandedDecl> *this)

{
  BrandedDecl *pBVar1;
  size_t sVar2;
  
  pBVar1 = this->ptr;
  if (pBVar1 != (BrandedDecl *)0x0) {
    sVar2 = this->size_;
    this->ptr = (BrandedDecl *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pBVar1,0xa8,sVar2,sVar2,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::
               destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }